

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::DepthDrawCase::iterate(DepthDrawCase *this)

{
  BBoxState BVar1;
  pointer pLVar2;
  RenderContext *context;
  int iVar3;
  int iVar4;
  int iVar5;
  deUint32 dVar6;
  undefined4 extraout_var;
  TestLog *pTVar8;
  TestError *this_00;
  ConstPixelBufferAccess *pCVar9;
  LogImageSet *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  undefined4 uVar10;
  qpTestResult testResult;
  qpTestResult qVar11;
  void *pvVar12;
  long lVar13;
  char *description;
  long lVar14;
  float fVar15;
  Surface viewport;
  Surface errorMask;
  size_type __dnew_3;
  Random rnd;
  size_type __dnew;
  size_type __dnew_1;
  Surface local_480;
  float local_468;
  int local_464;
  int local_460;
  int local_45c;
  string local_458;
  Surface local_438;
  float local_41c;
  string local_418;
  string local_3f8;
  string local_3d8;
  undefined1 local_3b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8;
  undefined1 local_390 [40];
  TextureFormat local_368;
  string local_360;
  string local_340;
  LogImageSet local_320;
  deRandom local_2e0;
  LogImage local_2d0;
  LogImage local_240;
  undefined1 local_1b0 [384];
  long lVar7;
  
  BVar1 = this->m_state;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar3);
  iVar3 = (**(code **)(lVar7 + 0x780))
                    ((((this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       .m_data.ptr)->m_program).m_program,"a_position");
  iVar4 = (**(code **)(lVar7 + 0x780))
                    ((((this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       .m_data.ptr)->m_program).m_program,"a_colorMix");
  local_45c = (**(code **)(lVar7 + 0xb48))
                        ((((this->m_program).
                           super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                           .m_data.ptr)->m_program).m_program,"u_depthBias");
  local_460 = (**(code **)(lVar7 + 0xb48))
                        ((((this->m_program).
                           super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                           .m_data.ptr)->m_program).m_program,"u_depthScale");
  local_464 = (**(code **)(lVar7 + 0xb48))
                        ((((this->m_program).
                           super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                           .m_data.ptr)->m_program).m_program,"u_color1");
  iVar5 = (**(code **)(lVar7 + 0xb48))
                    ((((this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       .m_data.ptr)->m_program).m_program,"u_color2");
  tcu::Surface::Surface(&local_480,0x100,0x100);
  deRandom_init(&local_2e0,0x213237);
  if (iVar3 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"posLocation != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0xf04);
  }
  else if (iVar4 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"colLocation != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0xf05);
  }
  else if (local_45c == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"depthBiasLocation != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0xf06);
  }
  else if (local_460 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"depthScaleLocation != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0xf07);
  }
  else if (local_464 == -1) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"color1Location != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0xf08);
  }
  else {
    if (iVar5 != -1) {
      (**(code **)(lVar7 + 0x1a00))(0,0,0x100,0x100);
      (**(code **)(lVar7 + 0x1c0))(0,0,0,0x3f800000);
      (**(code **)(lVar7 + 0x1d0))(0x3f800000);
      (**(code **)(lVar7 + 0x4a0))(0x201);
      (**(code **)(lVar7 + 0x5e0))(0xb71);
      (**(code **)(lVar7 + 0x188))(0x4100);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"setup viewport",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0xf11);
      (**(code **)(lVar7 + 0x40))
                (0x8892,(((this->m_vbo).
                          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                          .m_data.ptr)->super_ObjectWrapper).m_object);
      (**(code **)(lVar7 + 0x19f0))(iVar3,4,0x1406,0,0x20,0);
      (**(code **)(lVar7 + 0x19f0))(iVar4,4,0x1406,0,0x20,0x10);
      (**(code **)(lVar7 + 0x610))(iVar3);
      (**(code **)(lVar7 + 0x610))(iVar4);
      (**(code **)(lVar7 + 0x1680))
                ((((this->m_program).
                   super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                   m_data.ptr)->m_program).m_program);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"setup va",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0xf19);
      if (BVar1 == STATE_PER_PRIMITIVE) {
        (**(code **)(lVar7 + 0xfd8))(0x8e72,3);
      }
      if (0 < this->m_numLayers) {
        uVar10 = 4;
        if (BVar1 == STATE_PER_PRIMITIVE) {
          uVar10 = 0xe;
        }
        lVar14 = 0x18;
        lVar13 = 0;
        do {
          (**(code **)(lVar7 + 0x14e0))
                    (*(undefined4 *)
                      ((long)(&((this->m_layers).
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                                ._M_impl.super__Vector_impl_data._M_start)->color1 + -2) + lVar14),
                     local_45c);
          (**(code **)(lVar7 + 0x14e0))
                    (*(undefined4 *)
                      ((long)(((this->m_layers).
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                               ._M_impl.super__Vector_impl_data._M_start)->color1).m_data +
                      lVar14 + -0x1c),local_460);
          (**(code **)(lVar7 + 0x15a8))
                    (local_464,1,
                     (long)(&((this->m_layers).
                              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                              ._M_impl.super__Vector_impl_data._M_start)->color1 + -2) + 8 + lVar14)
          ;
          (**(code **)(lVar7 + 0x15a8))
                    (iVar5,1,(long)(((this->m_layers).
                                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->color1).m_data +
                             lVar14 + -8);
          if (this->m_state == STATE_GLOBAL) {
            fVar15 = 0.0;
            local_468 = 0.0;
            if (this->m_bboxSize != BBOX_EQUAL) {
              fVar15 = deRandom_getFloat(&local_2e0);
              fVar15 = fVar15 * 0.3;
            }
            local_41c = fVar15;
            if (this->m_bboxSize != BBOX_EQUAL) {
              local_468 = deRandom_getFloat(&local_2e0);
              local_468 = local_468 * 0.3;
            }
            pLVar2 = (this->m_layers).
                     super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            fVar15 = *(float *)((long)(&pLVar2->color1 + -2) + lVar14);
            (**(code **)(lVar7 + 0x1040))
                      (0xbf800000,0xbf800000,fVar15 - local_41c,0x3f800000,0x3f800000,0x3f800000,
                       fVar15 + *(float *)((long)(pLVar2->color1).m_data + lVar14 + -0x1c) +
                       local_468,0x3f800000);
          }
          (**(code **)(lVar7 + 0x538))(uVar10,0,this->m_gridSize * this->m_gridSize * 6);
          lVar13 = lVar13 + 1;
          lVar14 = lVar14 + 0x28;
        } while (lVar13 < this->m_numLayers);
      }
      context = ((this->super_TestCase).m_context)->m_renderCtx;
      local_2d0.m_name._M_dataplus._M_p = (pointer)0x300000008;
      pvVar12 = (void *)local_480.m_pixels.m_cap;
      if ((void *)local_480.m_pixels.m_cap != (void *)0x0) {
        pvVar12 = local_480.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2d0,local_480.m_width,
                 local_480.m_height,1,pvVar12);
      glu::readPixels(context,0,0,(PixelBufferAccess *)local_1b0);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"render and read",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                      ,0xf32);
      tcu::Surface::Surface(&local_438,local_480.m_width,local_480.m_height);
      local_2d0.m_name._M_dataplus._M_p = (pointer)0x300000008;
      pvVar12 = (void *)local_438.m_pixels.m_cap;
      if ((void *)local_438.m_pixels.m_cap != (void *)0x0) {
        pvVar12 = local_438.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1b0,(TextureFormat *)&local_2d0,local_438.m_width,
                 local_438.m_height,1,pvVar12);
      local_2d0.m_name._M_dataplus._M_p = (pointer)0x0;
      local_2d0.m_name._M_string_length = 0xff00000000;
      tcu::clear((PixelBufferAccess *)local_1b0,(IVec4 *)&local_2d0);
      testResult = QP_TEST_RESULT_PASS;
      if (0 < local_480.m_height) {
        qVar11 = testResult;
        testResult = QP_TEST_RESULT_PASS;
        do {
          if (0 < local_480.m_width) {
            iVar3 = 0;
            do {
              if (*(short *)((long)local_480.m_pixels.m_ptr +
                            (long)(int)(local_480.m_width * qVar11 + iVar3) * 4 + 1) != 0xff) {
                *(undefined4 *)
                 ((long)local_438.m_pixels.m_ptr +
                 (long)(int)(local_438.m_width * qVar11 + iVar3) * 4) = 0xff0000ff;
                testResult = QP_TEST_RESULT_FAIL;
              }
              iVar3 = iVar3 + 1;
            } while (iVar3 < local_480.m_width);
          }
          qVar11 = qVar11 + QP_TEST_RESULT_FAIL;
        } while ((int)qVar11 < local_480.m_height);
      }
      if (testResult == QP_TEST_RESULT_PASS) {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),"Result image ok.",0x10);
        pTVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        local_390._0_8_ = (long)local_390 + 0x10;
        local_390._16_4_ = 0x67616d49;
        local_390._20_2_ = 0x7365;
        local_390._8_8_ = 6;
        local_390[0x16] = '\0';
        local_3b8._0_8_ = &local_3a8;
        local_2d0.m_name._M_dataplus._M_p = (char *)0x12;
        local_3b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_3b8,(ulong)&local_2d0);
        local_3a8._M_allocated_capacity = (size_type)local_2d0.m_name._M_dataplus._M_p;
        *(undefined8 *)local_3b8._0_8_ = 0x6576206567616d49;
        builtin_strncpy((char *)(local_3b8._0_8_ + 8),"rificati",8);
        *(undefined2 *)(local_3b8._0_8_ + 0x10) = 0x6e6f;
        local_3b8._8_8_ = local_2d0.m_name._M_dataplus._M_p;
        local_2d0.m_name._M_dataplus._M_p[local_3b8._0_8_] = '\0';
        tcu::LogImageSet::LogImageSet
                  ((LogImageSet *)&local_240,(string *)local_390,(string *)local_3b8);
        tcu::TestLog::startImageSet
                  (pTVar8,local_240.m_name._M_dataplus._M_p,local_240.m_description._M_dataplus._M_p
                  );
        local_418.field_2._M_allocated_capacity = 0x74726f7077656956;
        local_418._M_string_length = 8;
        local_418.field_2._M_local_buf[8] = '\0';
        local_320.m_name._M_dataplus._M_p = (char *)0x11;
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
        local_458._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_458,(ulong)&local_320);
        local_458.field_2._M_allocated_capacity = (size_type)local_320.m_name._M_dataplus._M_p;
        builtin_strncpy(local_458._M_dataplus._M_p,"Viewport contents",0x11);
        local_458._M_string_length = (size_type)local_320.m_name._M_dataplus._M_p;
        local_458._M_dataplus._M_p[(long)local_320.m_name._M_dataplus._M_p] = '\0';
        local_3d8._M_dataplus._M_p = (pointer)0x300000008;
        if ((void *)local_480.m_pixels.m_cap != (void *)0x0) {
          local_480.m_pixels.m_cap = (size_t)local_480.m_pixels.m_ptr;
        }
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)&local_320,(TextureFormat *)&local_3d8,
                   local_480.m_width,local_480.m_height,1,(void *)local_480.m_pixels.m_cap);
        access = &local_320;
        tcu::LogImage::LogImage
                  (&local_2d0,&local_418,&local_458,(ConstPixelBufferAccess *)access,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_2d0,(int)pTVar8,__buf_01,(size_t)access);
        tcu::TestLog::endImageSet(pTVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
          operator_delete(local_2d0.m_description._M_dataplus._M_p,
                          local_2d0.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
          operator_delete(local_2d0.m_name._M_dataplus._M_p,
                          local_2d0.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,
                          (ulong)(local_458.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
          operator_delete(local_240.m_description._M_dataplus._M_p,
                          local_240.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
          operator_delete(local_240.m_name._M_dataplus._M_p,
                          local_240.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8._0_8_ != &local_3a8) {
          operator_delete((void *)local_3b8._0_8_,(ulong)(local_3a8._M_allocated_capacity + 1));
        }
        if (local_390._0_8_ != (long)local_390 + 0x10) {
          operator_delete((void *)local_390._0_8_,
                          CONCAT17(local_390[0x17],
                                   CONCAT16(local_390[0x16],
                                            CONCAT24(local_390._20_2_,local_390._16_4_))) + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        description = "Pass";
      }
      else {
        local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(local_1b0 + 8),"Image verification failed.",0x1a);
        pTVar8 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage
                           );
        local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
        local_418._M_string_length = 6;
        local_418.field_2._M_allocated_capacity._0_7_ = 0x736567616d49;
        local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
        local_2d0.m_name._M_dataplus._M_p = (char *)0x12;
        local_458._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_458,(ulong)&local_2d0);
        local_458.field_2._M_allocated_capacity = (size_type)local_2d0.m_name._M_dataplus._M_p;
        builtin_strncpy(local_458._M_dataplus._M_p,"Image verification",0x12);
        local_458._M_string_length = (size_type)local_2d0.m_name._M_dataplus._M_p;
        local_458._M_dataplus._M_p[(long)local_2d0.m_name._M_dataplus._M_p] = '\0';
        tcu::LogImageSet::LogImageSet(&local_320,&local_418,&local_458);
        tcu::TestLog::startImageSet
                  (pTVar8,local_320.m_name._M_dataplus._M_p,local_320.m_description._M_dataplus._M_p
                  );
        local_3d8._M_dataplus._M_p = (pointer)&local_3d8.field_2;
        local_3d8.field_2._M_allocated_capacity = 0x74726f7077656956;
        local_3d8._M_string_length = 8;
        local_3d8.field_2._M_local_buf[8] = '\0';
        local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
        local_240.m_name._M_dataplus._M_p = (pointer)0x11;
        local_3f8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f8,(ulong)&local_240);
        local_3f8.field_2._M_allocated_capacity = (size_type)local_240.m_name._M_dataplus._M_p;
        builtin_strncpy(local_3f8._M_dataplus._M_p,"Viewport contents",0x11);
        local_3f8._M_string_length = (size_type)local_240.m_name._M_dataplus._M_p;
        local_3f8._M_dataplus._M_p[(long)local_240.m_name._M_dataplus._M_p] = '\0';
        local_240.m_name._M_dataplus._M_p = (char *)0x300000008;
        if ((void *)local_480.m_pixels.m_cap != (void *)0x0) {
          local_480.m_pixels.m_cap = (size_t)local_480.m_pixels.m_ptr;
        }
        tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                  ((ConstPixelBufferAccess *)local_390,(TextureFormat *)&local_240,local_480.m_width
                   ,local_480.m_height,1,(void *)local_480.m_pixels.m_cap);
        pCVar9 = (ConstPixelBufferAccess *)local_390;
        tcu::LogImage::LogImage
                  (&local_2d0,&local_3d8,&local_3f8,pCVar9,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_2d0,(int)pTVar8,__buf,(size_t)pCVar9);
        local_340.field_2._M_allocated_capacity = 0x73614d726f727245;
        local_340.field_2._8_2_ = 0x6b;
        local_340._M_string_length = 9;
        local_360.field_2._M_allocated_capacity = 0x616d20726f727245;
        local_360.field_2._8_2_ = 0x6b73;
        local_360._M_string_length = 10;
        local_360.field_2._M_local_buf[10] = '\0';
        local_368.order = RGBA;
        local_368.type = UNORM_INT8;
        if ((void *)local_438.m_pixels.m_cap != (void *)0x0) {
          local_438.m_pixels.m_cap = (size_t)local_438.m_pixels.m_ptr;
        }
        local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
        local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_3b8,&local_368,local_438.m_width,local_438.m_height,1,
                   (void *)local_438.m_pixels.m_cap);
        pCVar9 = (ConstPixelBufferAccess *)local_3b8;
        tcu::LogImage::LogImage
                  (&local_240,&local_340,&local_360,pCVar9,QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write(&local_240,(int)pTVar8,__buf_00,(size_t)pCVar9);
        tcu::TestLog::endImageSet(pTVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
          operator_delete(local_240.m_description._M_dataplus._M_p,
                          local_240.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
          operator_delete(local_240.m_name._M_dataplus._M_p,
                          local_240.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_360._M_dataplus._M_p != &local_360.field_2) {
          operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_340._M_dataplus._M_p != &local_340.field_2) {
          operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
          operator_delete(local_2d0.m_description._M_dataplus._M_p,
                          local_2d0.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
          operator_delete(local_2d0.m_name._M_dataplus._M_p,
                          local_2d0.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p,
                          (ulong)(local_3f8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
          operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320.m_description._M_dataplus._M_p != &local_320.m_description.field_2) {
          operator_delete(local_320.m_description._M_dataplus._M_p,
                          local_320.m_description.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_320.m_name._M_dataplus._M_p != &local_320.m_name.field_2) {
          operator_delete(local_320.m_name._M_dataplus._M_p,
                          local_320.m_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_458._M_dataplus._M_p != &local_458.field_2) {
          operator_delete(local_458._M_dataplus._M_p,
                          (ulong)(local_458.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_dataplus._M_p != &local_418.field_2) {
          operator_delete(local_418._M_dataplus._M_p,local_418.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
        description = "Image verification failed";
      }
      tcu::Surface::~Surface(&local_438);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,
                 description);
      tcu::Surface::~Surface(&local_480);
      return STOP;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"color2Location != -1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
               ,0xf09);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

DepthDrawCase::IterateResult DepthDrawCase::iterate (void)
{
	const bool				hasTessellation		= (m_state == STATE_PER_PRIMITIVE);
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const glw::GLint		posLocation			= gl.getAttribLocation(m_program->getProgram(), "a_position");
	const glw::GLint		colLocation			= gl.getAttribLocation(m_program->getProgram(), "a_colorMix");
	const glw::GLint		depthBiasLocation	= gl.getUniformLocation(m_program->getProgram(), "u_depthBias");
	const glw::GLint		depthScaleLocation	= gl.getUniformLocation(m_program->getProgram(), "u_depthScale");
	const glw::GLint		color1Location		= gl.getUniformLocation(m_program->getProgram(), "u_color1");
	const glw::GLint		color2Location		= gl.getUniformLocation(m_program->getProgram(), "u_color2");

	tcu::Surface			viewport			(RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	de::Random				rnd					(0x213237);

	TCU_CHECK(posLocation != -1);
	TCU_CHECK(colLocation != -1);
	TCU_CHECK(depthBiasLocation != -1);
	TCU_CHECK(depthScaleLocation != -1);
	TCU_CHECK(color1Location != -1);
	TCU_CHECK(color2Location != -1);

	gl.viewport(0, 0, RENDER_AREA_SIZE, RENDER_AREA_SIZE);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clearDepthf(1.0f);
	gl.depthFunc(GL_LESS);
	gl.enable(GL_DEPTH_TEST);
	gl.clear(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "setup viewport");

	gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, (int)(8 * sizeof(float)), (const float*)DE_NULL);
	gl.vertexAttribPointer(colLocation, 4, GL_FLOAT, GL_FALSE, (int)(8 * sizeof(float)), (const float*)DE_NULL + 4);
	gl.enableVertexAttribArray(posLocation);
	gl.enableVertexAttribArray(colLocation);
	gl.useProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.getError(), "setup va");

	if (hasTessellation)
		gl.patchParameteri(GL_PATCH_VERTICES, 3);

	for (int layerNdx = 0; layerNdx < m_numLayers; ++layerNdx)
	{
		gl.uniform1f(depthBiasLocation, m_layers[layerNdx].zOffset);
		gl.uniform1f(depthScaleLocation, m_layers[layerNdx].zScale);
		gl.uniform4fv(color1Location, 1, m_layers[layerNdx].color1.getPtr());
		gl.uniform4fv(color2Location, 1, m_layers[layerNdx].color2.getPtr());

		if (m_state == STATE_GLOBAL)
		{
			const float negPadding = (m_bboxSize == BBOX_EQUAL) ? (0.0f) : (rnd.getFloat() * 0.3f);
			const float posPadding = (m_bboxSize == BBOX_EQUAL) ? (0.0f) : (rnd.getFloat() * 0.3f);

			gl.primitiveBoundingBox(-1.0f, -1.0f, m_layers[layerNdx].zOffset - negPadding, 1.0f,
									1.0f,  1.0f, (m_layers[layerNdx].zOffset + m_layers[layerNdx].zScale + posPadding), 1.0f);
		}

		gl.drawArrays((hasTessellation) ? (GL_PATCHES) : (GL_TRIANGLES), 0, m_gridSize * m_gridSize * 6);
	}

	glu::readPixels(m_context.getRenderContext(), 0, 0, viewport.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "render and read");

	if (verifyImage(viewport))
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");

	return STOP;
}